

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2ktx2.cpp
# Opt level: O2

void __thiscall ktxUpgrader::ktxUpgrader(ktxUpgrader *this)

{
  option my_option_list [3];
  option local_78;
  char *local_58;
  undefined4 local_50;
  undefined8 local_48;
  undefined4 local_40;
  char *local_38;
  undefined4 local_30;
  undefined8 local_28;
  undefined4 local_20;
  
  (this->super_ktxApp)._vptr_ktxApp = (_func_int **)&PTR_main_0011ea28;
  ktxApp::ktxApp(&this->super_ktxApp,&myversion_abi_cxx11_,&mydefversion_abi_cxx11_,
                 &(this->options).super_commandOptions);
  (this->super_ktxApp)._vptr_ktxApp = (_func_int **)&PTR_main_0011ea28;
  (this->options).super_commandOptions.infiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->options).super_commandOptions.infiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->options).super_commandOptions.infiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->options).super_commandOptions.outfile._M_dataplus._M_p =
       (pointer)&(this->options).super_commandOptions.outfile.field_2;
  (this->options).super_commandOptions.outfile._M_string_length = 0;
  (this->options).super_commandOptions.outfile.field_2._M_local_buf[0] = '\0';
  (this->options).super_commandOptions.test = 0;
  (this->options).super_commandOptions.warn = 1;
  (this->options).super_commandOptions.launchDebugger = 0;
  *(undefined4 *)((long)&(this->options).super_commandOptions.launchDebugger + 3) = 0;
  local_78.name = "force";
  local_78.has_arg = no_argument;
  local_78.flag = (int *)0x0;
  local_78.val = 0x66;
  local_58 = "outfile";
  local_50 = 1;
  local_48 = 0;
  local_40 = 0x6f;
  local_38 = "rewritebado";
  local_30 = 0;
  local_28 = 0;
  local_20 = 0x62;
  std::vector<argparser::option,std::allocator<argparser::option>>::insert<argparser::option*,void>
            ((vector<argparser::option,std::allocator<argparser::option>> *)
             &(this->super_ktxApp).option_list,
             (this->super_ktxApp).option_list.
             super__Vector_base<argparser::option,_std::allocator<argparser::option>_>._M_impl.
             super__Vector_impl_data._M_start,&local_78,(option *)&stack0xffffffffffffffe8);
  std::__cxx11::string::append((char *)&(this->super_ktxApp).short_opts);
  return;
}

Assistant:

ktxUpgrader::ktxUpgrader() : ktxApp(myversion, mydefversion, options)
{
    argparser::option my_option_list[] = {
        { "force", argparser::option::no_argument, NULL, 'f' },
        { "outfile", argparser::option::required_argument, NULL, 'o' },
        { "rewritebado", argparser::option::no_argument, NULL, 'b' },
    };
    const int lastOptionIndex = sizeof(my_option_list)
                                / sizeof(argparser::option);
    option_list.insert(option_list.begin(), my_option_list,
                       my_option_list + lastOptionIndex);
    short_opts += "bd:fo:";
}